

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_clear_error.c
# Opt level: O3

void test_archive_clear_error(void)

{
  int iVar1;
  archive *a;
  char *pcVar2;
  
  a = archive_read_new();
  archive_set_error(a,0xc,"abcdefgh");
  iVar1 = archive_errno(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_clear_error.c"
                      ,L'\"',0xc,"12",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar2 = archive_error_string(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_clear_error.c"
             ,L'#',"abcdefgh","\"abcdefgh\"",pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_clear_error(a);
  iVar1 = archive_errno(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_clear_error.c"
                      ,L'&',0,"0",(long)iVar1,"archive_errno(a)",(void *)0x0);
  pcVar2 = archive_error_string(a);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_archive_clear_error.c"
             ,L'\'',(char *)0x0,"NULL",pcVar2,"archive_error_string(a)",(void *)0x0,L'\0');
  archive_read_free(a);
  return;
}

Assistant:

DEFINE_TEST(test_archive_clear_error)
{
	struct archive* a = archive_read_new();

	archive_set_error(a, 12, "abcdefgh");
	assertEqualInt(12, archive_errno(a));
	assertEqualString("abcdefgh", archive_error_string(a));

	archive_clear_error(a);
	assertEqualInt(0, archive_errno(a));
	assertEqualString(NULL, archive_error_string(a));

	archive_read_free(a);
}